

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Stmt * __thiscall parser::Parser::parseStatement(Parser *this)

{
  bool bVar1;
  Parser *this_local;
  
  switch((this->curToken).Type) {
  case DEFINE:
    bVar1 = peekTokenIs(this,LBRACE);
    if (bVar1) {
      this_local = (Parser *)parseExpressionStatement(this);
    }
    else {
      this_local = (Parser *)parseFunctionStatement(this);
    }
    break;
  case INIT:
    this_local = (Parser *)parseInitStatement(this);
    break;
  case DECLARE:
    this_local = (Parser *)parseDeclStatement(this);
    break;
  default:
    this_local = (Parser *)parseExpressionStatement(this);
    break;
  case NEWLINE:
    this_local = (Parser *)0x0;
    break;
  case IF:
    this_local = (Parser *)parseIfStatement(this);
    break;
  case FOR:
    this_local = (Parser *)parseForIntRangeStatement(this);
    break;
  case RETURN:
    this_local = (Parser *)parseReturnStatement(this);
  }
  return (Stmt *)this_local;
}

Assistant:

Stmt* Parser::parseStatement()
{
    switch (curToken.Type) {
       case TokenType::IF:
           return parseIfStatement();
       case TokenType::FOR:
           return parseForIntRangeStatement();
       case TokenType::DECLARE:
           return parseDeclStatement();
       case TokenType::INIT:
           return parseInitStatement();
       case TokenType::DEFINE:
           if(peekTokenIs(TokenType::LBRACE)){
               return parseExpressionStatement();
           }
           return parseFunctionStatement();
       case TokenType::RETURN:
            return parseReturnStatement();
       case TokenType::NEWLINE:
             return nullptr;
       default:
           return parseExpressionStatement();
    }
}